

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall
irr::scene::CSceneManager::setActiveCamera(CSceneManager *this,ICameraSceneNode *camera)

{
  long *in_RSI;
  IReferenceCounted *in_RDI;
  
  if (in_RSI != (long *)0x0) {
    IReferenceCounted::grab((IReferenceCounted *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
  }
  if (in_RDI[0x15].DebugName != (c8 *)0x0) {
    IReferenceCounted::drop(in_RDI);
  }
  in_RDI[0x15].DebugName = (c8 *)in_RSI;
  return;
}

Assistant:

void CSceneManager::setActiveCamera(ICameraSceneNode *camera)
{
	if (camera)
		camera->grab();
	if (ActiveCamera)
		ActiveCamera->drop();

	ActiveCamera = camera;
}